

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode gzip_unencode_write(connectdata *conn,contenc_writer *writer,char *buf,size_t nbytes)

{
  long lVar1;
  anon_enum_32 aVar2;
  CURLcode CVar3;
  content_encoding *pcVar4;
  uint uVar5;
  int iVar6;
  zlibInitState zStack_50;
  ssize_t hlen;
  content_encoding *local_38;
  
  iVar6 = (int)nbytes;
  if (*(int *)&writer->params - 1U < 6) {
    switch(*(int *)&writer->params) {
    case 1:
      aVar2 = check_gzip_header((uchar *)buf,nbytes,&hlen);
      lVar1 = hlen;
      if (aVar2 != CURLDIGESTALGO_MD5) {
        if (aVar2 != CURLDIGESTALGO_SHA256) {
LAB_0010f8da:
          process_zlib_error(conn,(z_stream *)(writer + 1));
          CVar3 = CURLE_BAD_CONTENT_ENCODING;
          goto LAB_0010f922;
        }
        *(int *)&writer[1].downstream = iVar6;
        pcVar4 = (content_encoding *)(*Curl_cmalloc)(nbytes & 0xffffffff);
        writer[1].handler = pcVar4;
        if (pcVar4 != (content_encoding *)0x0) {
          memcpy(pcVar4,buf,(ulong)*(uint *)&writer[1].downstream);
          *(undefined4 *)&writer->params = 4;
          return CURLE_OK;
        }
LAB_0010f920:
        CVar3 = CURLE_OUT_OF_MEMORY;
LAB_0010f922:
        CVar3 = exit_zlib(conn,(z_stream *)(writer + 1),(zlibInitState *)&writer->params,CVar3);
        return CVar3;
      }
      break;
    default:
      goto switchD_0010f81d_caseD_2;
    case 3:
      writer[1].handler = (content_encoding *)buf;
      *(int *)&writer[1].downstream = iVar6;
      CVar3 = process_trailer(conn,(zlib_params *)&writer->params);
      return CVar3;
    case 4:
      uVar5 = *(int *)&writer[1].downstream + iVar6;
      *(uint *)&writer[1].downstream = uVar5;
      pcVar4 = (content_encoding *)Curl_saferealloc(writer[1].handler,(ulong)uVar5);
      writer[1].handler = pcVar4;
      if (pcVar4 == (content_encoding *)0x0) goto LAB_0010f920;
      memcpy((void *)((long)pcVar4 + (*(uint *)&writer[1].downstream - nbytes)),buf,nbytes);
      local_38 = writer[1].handler;
      aVar2 = check_gzip_header((uchar *)local_38,(ulong)*(uint *)&writer[1].downstream,&hlen);
      if (aVar2 != CURLDIGESTALGO_MD5) {
        if (aVar2 == CURLDIGESTALGO_SHA256) {
          return CURLE_OK;
        }
        goto LAB_0010f8da;
      }
      (*Curl_cfree)(local_38);
      lVar1 = hlen + nbytes;
      nbytes = (size_t)*(uint *)&writer[1].downstream;
      lVar1 = lVar1 - nbytes;
      break;
    case 6:
      writer[1].handler = (content_encoding *)buf;
      *(int *)&writer[1].downstream = iVar6;
      zStack_50 = ZLIB_INIT_GZIP;
      goto LAB_0010f977;
    }
    writer[1].handler = (content_encoding *)(buf + lVar1);
    uVar5 = (int)nbytes - (int)hlen;
    nbytes = (size_t)uVar5;
    *(uint *)&writer[1].downstream = uVar5;
    *(undefined4 *)&writer->params = 5;
  }
  else {
switchD_0010f81d_caseD_2:
    writer[1].handler = (content_encoding *)buf;
    *(int *)&writer[1].downstream = iVar6;
  }
  if ((int)nbytes == 0) {
    return CURLE_OK;
  }
  zStack_50 = ZLIB_GZIP_INFLATING;
LAB_0010f977:
  CVar3 = inflate_stream(conn,writer,zStack_50);
  return CVar3;
}

Assistant:

static CURLcode gzip_unencode_write(struct connectdata *conn,
                                    struct contenc_writer *writer,
                                    const char *buf, size_t nbytes)
{
  struct zlib_params *zp = (struct zlib_params *) &writer->params;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(zp->zlib_init == ZLIB_INIT_GZIP) {
    /* Let zlib handle the gzip decompression entirely */
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    /* Now uncompress the data */
    return inflate_stream(conn, writer, ZLIB_INIT_GZIP);
  }

#ifndef OLD_ZLIB_SUPPORT
  /* Support for old zlib versions is compiled away and we are running with
     an old version, so return an error. */
  return exit_zlib(conn, z, &zp->zlib_init, CURLE_WRITE_ERROR);

#else
  /* This next mess is to get around the potential case where there isn't
   * enough data passed in to skip over the gzip header.  If that happens, we
   * malloc a block and copy what we have then wait for the next call.  If
   * there still isn't enough (this is definitely a worst-case scenario), we
   * make the block bigger, copy the next part in and keep waiting.
   *
   * This is only required with zlib versions < 1.2.0.4 as newer versions
   * can handle the gzip header themselves.
   */

  switch(zp->zlib_init) {
  /* Skip over gzip header? */
  case ZLIB_INIT:
  {
    /* Initial call state */
    ssize_t hlen;

    switch(check_gzip_header((unsigned char *) buf, nbytes, &hlen)) {
    case GZIP_OK:
      z->next_in = (Bytef *) buf + hlen;
      z->avail_in = (uInt) (nbytes - hlen);
      zp->zlib_init = ZLIB_GZIP_INFLATING; /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We need more data so we can find the end of the gzip header.  It's
       * possible that the memory block we malloc here will never be freed if
       * the transfer abruptly aborts after this point.  Since it's unlikely
       * that circumstances will be right for this code path to be followed in
       * the first place, and it's even more unlikely for a transfer to fail
       * immediately afterwards, it should seldom be a problem.
       */
      z->avail_in = (uInt) nbytes;
      z->next_in = malloc(z->avail_in);
      if(z->next_in == NULL) {
        return exit_zlib(conn, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);
      }
      memcpy(z->next_in, buf, z->avail_in);
      zp->zlib_init = ZLIB_GZIP_HEADER;  /* Need more gzip header data state */
      /* We don't have any data to inflate yet */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(conn, z, &zp->zlib_init, process_zlib_error(conn, z));
    }

  }
  break;

  case ZLIB_GZIP_HEADER:
  {
    /* Need more gzip header data state */
    ssize_t hlen;
    z->avail_in += (uInt) nbytes;
    z->next_in = Curl_saferealloc(z->next_in, z->avail_in);
    if(z->next_in == NULL) {
      return exit_zlib(conn, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);
    }
    /* Append the new block of data to the previous one */
    memcpy(z->next_in + z->avail_in - nbytes, buf, nbytes);

    switch(check_gzip_header(z->next_in, z->avail_in, &hlen)) {
    case GZIP_OK:
      /* This is the zlib stream data */
      free(z->next_in);
      /* Don't point into the malloced block since we just freed it */
      z->next_in = (Bytef *) buf + hlen + nbytes - z->avail_in;
      z->avail_in = (uInt) (z->avail_in - hlen);
      zp->zlib_init = ZLIB_GZIP_INFLATING;   /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We still don't have any data to inflate! */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(conn, z, &zp->zlib_init, process_zlib_error(conn, z));
    }

  }
  break;

  case ZLIB_EXTERNAL_TRAILER:
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    return process_trailer(conn, zp);

  case ZLIB_GZIP_INFLATING:
  default:
    /* Inflating stream state */
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    break;
  }

  if(z->avail_in == 0) {
    /* We don't have any data to inflate; wait until next time */
    return CURLE_OK;
  }

  /* We've parsed the header, now uncompress the data */
  return inflate_stream(conn, writer, ZLIB_GZIP_INFLATING);
#endif
}